

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_server.hpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cinatra::coro_http_server::
build_part_heads<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>
          (coro_http_server *this,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *ranges,
          string_view mime,string_view file_size_str,size_t *content_len)

{
  bool bVar1;
  reference ppVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  size_type sVar4;
  undefined8 in_RDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  long *in_R9;
  size_t part_size;
  string part_header;
  type_conflict2 *end;
  type_conflict2 *start;
  iterator __end0;
  iterator __begin0;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *multi_heads;
  value_type *in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  _If_sv<std::basic_string_view<char>,_basic_string<char>_&> in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  _If_sv<std::basic_string_view<char>,_basic_string<char>_&> in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  int __val;
  allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  int *local_68;
  int *local_60;
  pair<int,_int> local_58;
  pair<int,_int> *local_50;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_48;
  undefined8 local_40;
  undefined1 local_31;
  long *local_30;
  undefined8 local_28;
  
  local_31 = 0;
  local_30 = in_R9;
  local_28 = in_RDX;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x30f41e);
  local_40 = local_28;
  local_48._M_current =
       (pair<int,_int> *)
       std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                 ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                  in_stack_fffffffffffffe98);
  local_50 = (pair<int,_int> *)
             std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                       ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                        in_stack_fffffffffffffe98);
  while (bVar1 = __gnu_cxx::
                 operator==<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                           ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                             *)in_stack_fffffffffffffea0,
                            (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                             *)in_stack_fffffffffffffe98), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppVar2 = __gnu_cxx::
             __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
             ::operator*(&local_48);
    local_58 = *ppVar2;
    local_60 = std::get<0ul,int,int>((pair<int,_int> *)0x30f4a2);
    local_68 = std::get<1ul,int,int>((pair<int,_int> *)0x30f4b4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,
               (allocator<char> *)in_stack_fffffffffffffed0);
    std::allocator<char>::~allocator(&local_89);
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    __val = (int)((ulong)pbVar3 >> 0x20);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    in_stack_fffffffffffffee0 =
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                   (in_stack_fffffffffffffeb0,(char *)in_stack_fffffffffffffea8);
    in_stack_fffffffffffffed8 =
         std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                   (in_stack_fffffffffffffec0,
                    (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffeb8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    in_stack_fffffffffffffed0 =
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                   (in_stack_fffffffffffffeb0,(char *)in_stack_fffffffffffffea8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_stack_fffffffffffffeb0,(char *)in_stack_fffffffffffffea8);
    std::__cxx11::to_string(__val);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    in_stack_fffffffffffffec0 =
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                   (in_stack_fffffffffffffeb0,(char *)in_stack_fffffffffffffea8);
    std::__cxx11::to_string(__val);
    in_stack_fffffffffffffeb8 =
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                   (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    in_stack_fffffffffffffeb0 =
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                   (in_stack_fffffffffffffeb0,(char *)in_stack_fffffffffffffea8);
    in_stack_fffffffffffffea8 =
         std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                   (in_stack_fffffffffffffec0,
                    (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffeb8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    std::__cxx11::string::~string(in_stack_fffffffffffffea0);
    std::__cxx11::string::~string(in_stack_fffffffffffffea0);
    in_stack_fffffffffffffea0 = &local_88;
    sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (in_stack_fffffffffffffea0);
    *local_30 = *local_30 + sVar4;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    in_stack_fffffffffffffe98 = (value_type *)(long)((*local_68 + 1) - *local_60);
    sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CRCF_abi_cxx11_);
    *local_30 = (long)&(((_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *
                         )&in_stack_fffffffffffffe98->_M_dataplus)->_M_impl).super__Vector_impl_data
                       ._M_start + *local_30 + sVar4;
    std::__cxx11::string::~string(in_stack_fffffffffffffea0);
    __gnu_cxx::
    __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
    ::operator++(&local_48);
  }
  sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     BOUNDARY_abi_cxx11_);
  *local_30 = sVar4 + 4 + *local_30;
  return in_RDI;
}

Assistant:

std::vector<std::string> build_part_heads(auto &ranges, std::string_view mime,
                                            std::string_view file_size_str,
                                            size_t &content_len) {
    std::vector<std::string> multi_heads;
    for (auto [start, end] : ranges) {
      std::string part_header = "--";
      part_header.append(BOUNDARY).append(CRCF);
      part_header.append("Content-Type: ").append(mime).append(CRCF);
      part_header.append("Content-Range: ").append("bytes ");
      part_header.append(std::to_string(start))
          .append("-")
          .append(std::to_string(end))
          .append("/")
          .append(file_size_str)
          .append(TWO_CRCF);
      content_len += part_header.size();
      multi_heads.push_back(std::move(part_header));
      size_t part_size = end + 1 - start + CRCF.size();
      content_len += part_size;
    }
    content_len += (BOUNDARY.size() + 4);
    return multi_heads;
  }